

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64InstPrinter.c
# Opt level: O3

void printPrefetchOp(MCInst *MI,uint OpNum,SStream *O)

{
  byte bVar1;
  cs_detail *pcVar2;
  cs_struct *h;
  uint id;
  undefined8 in_RAX;
  MCOperand *op;
  ulong uVar3;
  char *s;
  uint8_t *puVar4;
  uint8_t uVar5;
  uint32_t Value;
  _Bool Valid;
  _Bool local_21;
  
  local_21 = SUB81((ulong)in_RAX >> 0x38,0);
  op = MCInst_getOperand(MI,OpNum);
  uVar3 = MCOperand_getImm(op);
  Value = (uint32_t)uVar3;
  s = A64NamedImmMapper_toString(&A64PRFM_PRFMMapper,Value,&local_21);
  if (local_21 == true) {
    SStream_concat0(O,s);
    if (MI->csh->detail == CS_OPT_OFF) {
      return;
    }
    pcVar2 = MI->flat_insn->detail;
    puVar4 = pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[2] * 0x38 + 0x2d;
    puVar4[0] = 'E';
    puVar4[1] = '\0';
    puVar4[2] = '\0';
    puVar4[3] = '\0';
    pcVar2 = MI->flat_insn->detail;
    *(uint32_t *)(pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[2] * 0x38 + 0x35) = Value + 1
    ;
  }
  else {
    printInt32Bang(O,Value);
    h = MI->csh;
    if (h->detail == CS_OPT_OFF) {
      return;
    }
    id = MCInst_getOpcode(MI);
    bVar1 = MI->ac_idx;
    puVar4 = AArch64_get_op_access(h,id);
    uVar5 = '\0';
    if (puVar4[bVar1] != 0x80) {
      uVar5 = puVar4[bVar1];
    }
    pcVar2 = MI->flat_insn->detail;
    pcVar2->groups[(ulong)(pcVar2->field_6).x86.opcode[2] * 0x38 + 0x45] = uVar5;
    MI->ac_idx = MI->ac_idx + '\x01';
    pcVar2 = MI->flat_insn->detail;
    puVar4 = pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[2] * 0x38 + 0x2d;
    puVar4[0] = '\x02';
    puVar4[1] = '\0';
    puVar4[2] = '\0';
    puVar4[3] = '\0';
    pcVar2 = MI->flat_insn->detail;
    *(ulong *)(pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[2] * 0x38 + 0x35) =
         uVar3 & 0xffffffff;
  }
  puVar4 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
  *puVar4 = *puVar4 + '\x01';
  return;
}

Assistant:

static void printPrefetchOp(MCInst *MI, unsigned OpNum, SStream *O)
{
	unsigned prfop = (unsigned)MCOperand_getImm(MCInst_getOperand(MI, OpNum));
	bool Valid;
	const char *Name = A64NamedImmMapper_toString(&A64PRFM_PRFMMapper, prfop, &Valid);

	if (Valid) {
		SStream_concat0(O, Name);
		if (MI->csh->detail) {
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_PREFETCH;
			// we have to plus 1 to prfop because 0 is a valid value of prfop
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].prefetch = prfop + 1;
			MI->flat_insn->detail->arm64.op_count++;
		}
	} else {
		printInt32Bang(O, prfop);
		if (MI->csh->detail) {
#ifndef CAPSTONE_DIET
			uint8_t access;
			access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
			MI->ac_idx++;
#endif
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = prfop;
			MI->flat_insn->detail->arm64.op_count++;
		}
	}
}